

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::setRange(ProgressBar *this,int minimum,int maximum)

{
  int iVar1;
  ProgressBarPrivate *pPVar2;
  int *piVar3;
  int local_18;
  int local_14;
  int maximum_local;
  int minimum_local;
  ProgressBar *this_local;
  
  local_18 = maximum;
  local_14 = minimum;
  _maximum_local = this;
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  iVar1 = local_18;
  if ((minimum != pPVar2->minimum) ||
     (pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d), iVar1 != pPVar2->maximum)) {
    iVar1 = local_14;
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    pPVar2->minimum = iVar1;
    piVar3 = qMax<int>(&local_14,&local_18);
    iVar1 = *piVar3;
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    pPVar2->maximum = iVar1;
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar1 = pPVar2->value;
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar2->minimum + -1 <= iVar1) {
      pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar2->value;
      pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      if (iVar1 <= pPVar2->maximum) {
        QWidget::update();
        return;
      }
    }
    reset(this);
  }
  return;
}

Assistant:

void
ProgressBar::setRange( int minimum, int maximum )
{
	if( minimum != d->minimum || maximum != d->maximum )
	{
		d->minimum = minimum;
		d->maximum = qMax( minimum, maximum );

		if( d->value < ( d->minimum - 1 ) || d->value > d->maximum )
			reset();
		else
			update();
	}
}